

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall kratos::AssertPropertyVisitor::visit(AssertPropertyVisitor *this,AssertBase *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  pointer port_name_00;
  bool bVar1;
  int iVar2;
  VarType VVar3;
  VarCastType VVar4;
  element_type *this_00;
  Property *this_01;
  EventControl *pEVar5;
  Sequence *pSVar6;
  size_type sVar7;
  element_type *peVar8;
  element_type *peVar9;
  undefined4 extraout_var;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *this_03;
  Var **ppVVar10;
  undefined4 extraout_var_00;
  element_type *this_04;
  reference ppVVar11;
  StmtException *this_05;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  char (*format_str) [36];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str_00;
  allocator<kratos::IRNode_*> local_2b9;
  IRNode *local_2b8;
  iterator local_2b0;
  size_type local_2a8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_2a0;
  string local_288;
  string local_268;
  undefined1 local_248 [8];
  shared_ptr<kratos::VarCasted> casted;
  Var *src_var;
  shared_ptr<kratos::AssignStmt> *assign;
  iterator __end6;
  iterator __begin6;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range6;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  source;
  shared_ptr<kratos::Port> clk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *clk_name;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clks;
  shared_ptr<kratos::Generator> *gen;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range4_1;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  children;
  element_type *local_148;
  __node_base local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  element_type *local_110;
  undefined1 local_108 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clk_ports;
  Generator *generator;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> clk_vars;
  Sequence *seq;
  EventControl *edge;
  Property *property;
  shared_ptr<kratos::AssertPropertyStmt> property_stmt;
  AssertBase *stmt_local;
  AssertPropertyVisitor *this_local;
  unsigned_long_long local_80;
  undefined1 local_78 [16];
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  undefined1 local_50 [8];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  __node_base local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  Context *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  Context *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  property_stmt.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  iVar2 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[0xd])();
  if (iVar2 == 1) {
    Stmt::as<kratos::AssertPropertyStmt>((Stmt *)&property);
    this_00 = std::
              __shared_ptr_access<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&property);
    this_01 = AssertPropertyStmt::property(this_00);
    pEVar5 = Property::edge(this_01);
    clk_vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &Property::sequence(this_01)->var_;
    if ((pEVar5->var == (Var *)0x0) &&
       (pSVar6 = Sequence::next((Sequence *)
                                clk_vars.
                                super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage),
       pSVar6 != (Sequence *)0x0)) {
      std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::vector
                ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&generator);
      clk_ports.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)Stmt::generator_parent
                              ((Stmt *)property_stmt.
                                       super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
      Generator::get_ports_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_108,
                 (Generator *)
                 clk_ports.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,Clock);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_108);
      port_name_00 = clk_ports.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (sVar7 == 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
        Generator::get_port((Generator *)&__range4,port_name_00);
        local_110 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&__range4);
        std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Port*>
                  ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&generator,&local_110);
        std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&__range4);
      }
      else {
        __end4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_108);
        port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_108);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&port_name), bVar1) {
          local_140._M_nxt =
               (_Hash_node_base *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end4);
          Generator::get_port((Generator *)
                              &children.
                               super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              clk_ports.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_148 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                 &children.
                                  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Port*>
                    ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&generator,&local_148);
          std::shared_ptr<kratos::Port>::~shared_ptr
                    ((shared_ptr<kratos::Port> *)
                     &children.
                      super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
      bVar1 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::empty
                        ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&generator);
      if (bVar1) {
        Generator::get_child_generators
                  ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    *)&__range4_1,
                   (Generator *)
                   clk_ports.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __end4_1 = std::
                   vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   ::begin((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                            *)&__range4_1);
        gen = (shared_ptr<kratos::Generator> *)
              std::
              vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              ::end((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                     *)&__range4_1);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                                   *)&gen), bVar1) {
          clks.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)__gnu_cxx::
                        __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                        ::operator*(&__end4_1);
          peVar8 = std::
                   __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)clks.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Generator::get_ports_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range5,peVar8,Clock);
          __end5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range5);
          clk_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range5);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&clk_name), bVar1) {
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end5);
            peVar8 = std::
                     __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)clks.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Generator::get_port((Generator *)&source._M_h._M_single_bucket,(string *)peVar8);
            peVar9 = std::
                     __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&source._M_h._M_single_bucket);
            iVar2 = (*(peVar9->super_Var).super_IRNode._vptr_IRNode[0x10])();
            std::
            unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
            ::unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                             *)&__range6,
                            (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                             *)CONCAT44(extraout_var,iVar2));
            __end6 = std::
                     unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                     ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                              *)&__range6);
            assign = (shared_ptr<kratos::AssignStmt> *)
                     std::
                     unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                     ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                            *)&__range6);
            while (bVar1 = std::__detail::operator!=
                                     (&__end6.
                                       super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                      ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                        *)&assign), bVar1) {
              this_02 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)std::__detail::
                           _Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                           operator*(&__end6);
              this_03 = std::
                        __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(this_02);
              ppVVar10 = AssignStmt::right(this_03);
              casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppVVar10;
              iVar2 = (*(((Var *)casted.
                                 super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->super_IRNode)._vptr_IRNode[0xd])();
              if (((pointer)CONCAT44(extraout_var_00,iVar2) ==
                   clk_ports.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) &&
                 (VVar3 = Var::type((Var *)casted.
                                           super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi), VVar3 == BaseCasted)) {
                Var::as<kratos::VarCasted>((Var *)local_248);
                this_04 = std::
                          __shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_248);
                VVar4 = VarCasted::cast_type(this_04);
                if (VVar4 == Clock) {
                  std::vector<kratos::Var*,std::allocator<kratos::Var*>>::
                  emplace_back<kratos::Var*&>
                            ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&generator,
                             (Var **)&casted.
                                      super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                }
                std::shared_ptr<kratos::VarCasted>::~shared_ptr
                          ((shared_ptr<kratos::VarCasted> *)local_248);
              }
              std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
              operator++(&__end6);
            }
            std::
            unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
            ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                              *)&__range6);
            std::shared_ptr<kratos::Port>::~shared_ptr
                      ((shared_ptr<kratos::Port> *)&source._M_h._M_single_bucket);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end5);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range5);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
          ::operator++(&__end4_1);
        }
        std::
        vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)&__range4_1);
      }
      sVar7 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::size
                        ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&generator);
      if (sVar7 != 1) {
        this_05 = (StmtException *)__cxa_allocate_exception(0x10);
        Sequence::to_string_abi_cxx11_
                  (&local_288,
                   (Sequence *)
                   clk_vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_268;
        local_40._M_nxt = (_Hash_node_base *)0x4668e5;
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_288;
        local_68.named_args.data =
             (named_arg_info<char> *)
             fmt::v7::make_args_checked<std::__cxx11::string,char[36],char>
                       ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)"Clock edge not set for sequence {0}",(v7 *)vargs,format_str,in_RCX);
        local_50 = (undefined1  [8])&local_68;
        local_78 = (undefined1  [16])fmt::v7::to_string_view<char,_0>((char *)local_40._M_nxt);
        local_28 = (Context *)&this_local;
        local_30 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
                    *)local_50;
        local_20 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
                    *)local_50;
        local_10 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
                    *)local_50;
        local_18 = local_28;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_28,0xd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_50);
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = local_80;
        format_str_00.size_ = (size_t)this_local;
        format_str_00.data_ = (char *)local_78._8_8_;
        fmt::v7::detail::vformat_abi_cxx11_(&local_268,(detail *)local_78._0_8_,format_str_00,args);
        local_2b8 = (IRNode *)
                    property_stmt.
                    super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
        local_2b0 = &local_2b8;
        local_2a8 = 1;
        std::allocator<kratos::IRNode_*>::allocator(&local_2b9);
        __l._M_len = local_2a8;
        __l._M_array = local_2b0;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_2a0,__l,&local_2b9);
        StmtException::StmtException(this_05,&local_268,&local_2a0);
        __cxa_throw(this_05,&StmtException::typeinfo,StmtException::~StmtException);
      }
      ppVVar11 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::operator[]
                           ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&generator,0);
      pEVar5->var = *ppVVar11;
      pEVar5->edge = Posedge;
      pEVar5->type = Edge;
      std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~vector
                ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&generator);
    }
    std::shared_ptr<kratos::AssertPropertyStmt>::~shared_ptr
              ((shared_ptr<kratos::AssertPropertyStmt> *)&property);
  }
  return;
}

Assistant:

void visit(AssertBase* stmt) override {
        if (stmt->assert_type() != AssertType::AssertProperty) {
            return;
        }
        auto property_stmt = stmt->as<AssertPropertyStmt>();
        auto* property = property_stmt->property();

        auto& edge = property->edge();
        auto* seq = property->sequence();
        // automatically determine the clock, only if it's safe to do so (only one clock in the
        // design
        if (!edge.var && seq->next()) {
            std::vector<Var*> clk_vars;
            // try to determine the clock
            // it's a concurrent property, we have to have a clock
            auto* generator = stmt->generator_parent();
            {
                auto clk_ports = generator->get_ports(PortType::Clock);
                if (clk_ports.size() == 1) {
                    // that's it
                    clk_vars.emplace_back(generator->get_port(clk_ports.front()).get());
                } else {
                    for (auto const& port_name : clk_ports) {
                        clk_vars.emplace_back(generator->get_port(port_name).get());
                    }
                }
            }
            if (clk_vars.empty()) {
                // there might be some casted types, typically in test bench
                // we need to source for connected modules to see what they are connected to
                auto children = generator->get_child_generators();
                for (auto const& gen : children) {
                    auto clks = gen->get_ports(PortType::Clock);
                    for (auto const& clk_name : clks) {
                        auto clk = gen->get_port(clk_name);
                        auto source = clk->sources();
                        for (auto const& assign : source) {
                            auto* src_var = assign->right();
                            if (src_var->generator() == generator) {
                                if (src_var->type() == VarType::BaseCasted) {
                                    // only casted to clock
                                    auto casted = src_var->as<VarCasted>();
                                    if (casted->cast_type() == VarCastType::Clock)
                                        clk_vars.emplace_back(src_var);
                                }
                            }
                        }
                    }
                }
            }

            if (clk_vars.size() == 1) {
                edge.var = clk_vars[0];
                edge.edge = EventEdgeType::Posedge;
                edge.type = EventControlType::Edge;
            } else {
                // next is not null but edge is not set
                throw StmtException(
                    ::format("Clock edge not set for sequence {0}", seq->to_string()), {stmt});
            }
        }
    }